

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O1

_Bool netaddr_acl_check_accept(netaddr_acl *acl,netaddr *addr)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  undefined1 uVar4;
  ulong uVar5;
  netaddr *pnVar6;
  bool bVar7;
  
  if (acl->reject_first == true) {
    uVar1 = acl->reject_count;
    bVar7 = uVar1 != 0;
    if (bVar7) {
      pnVar6 = acl->reject;
      _Var3 = netaddr_is_in_subnet(pnVar6,addr);
      if (!_Var3) {
        uVar2 = 1;
        do {
          uVar5 = uVar2;
          pnVar6 = pnVar6 + 1;
          if (uVar1 == uVar5) break;
          _Var3 = netaddr_is_in_subnet(pnVar6,addr);
          uVar2 = uVar5 + 1;
        } while (!_Var3);
        bVar7 = uVar5 < uVar1;
      }
    }
    if (!bVar7) goto LAB_00129cd2;
LAB_00129d81:
    uVar4 = 0;
  }
  else {
LAB_00129cd2:
    uVar1 = acl->accept_count;
    bVar7 = uVar1 != 0;
    if (bVar7) {
      pnVar6 = acl->accept;
      _Var3 = netaddr_is_in_subnet(pnVar6,addr);
      if (!_Var3) {
        uVar2 = 1;
        do {
          uVar5 = uVar2;
          pnVar6 = pnVar6 + 1;
          if (uVar1 == uVar5) break;
          _Var3 = netaddr_is_in_subnet(pnVar6,addr);
          uVar2 = uVar5 + 1;
        } while (!_Var3);
        bVar7 = uVar5 < uVar1;
      }
    }
    if (bVar7) {
      return true;
    }
    if (acl->reject_first == false) {
      uVar1 = acl->reject_count;
      bVar7 = uVar1 != 0;
      if (bVar7) {
        pnVar6 = acl->reject;
        _Var3 = netaddr_is_in_subnet(pnVar6,addr);
        if (!_Var3) {
          uVar2 = 1;
          do {
            uVar5 = uVar2;
            pnVar6 = pnVar6 + 1;
            if (uVar1 == uVar5) break;
            _Var3 = netaddr_is_in_subnet(pnVar6,addr);
            uVar2 = uVar5 + 1;
          } while (!_Var3);
          bVar7 = uVar5 < uVar1;
        }
      }
      if (bVar7) goto LAB_00129d81;
    }
    uVar4 = acl->accept_default;
  }
  return (_Bool)uVar4;
}

Assistant:

bool
netaddr_acl_check_accept(const struct netaddr_acl *acl, const struct netaddr *addr) {
  if (acl->reject_first) {
    if (_is_in_array(acl->reject, acl->reject_count, addr)) {
      return false;
    }
  }

  if (_is_in_array(acl->accept, acl->accept_count, addr)) {
    return true;
  }

  if (!acl->reject_first) {
    if (_is_in_array(acl->reject, acl->reject_count, addr)) {
      return false;
    }
  }

  return acl->accept_default;
}